

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

int cmdParse(char *buf,uintptr_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uintptr_t *val;
  uintptr_t *val_00;
  char cVar1;
  cmdCtlParse_t *pcVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  bool bVar8;
  int i;
  ulong uVar10;
  char *__s;
  char *pcVar11;
  long lVar12;
  size_t __n;
  cmdCtlParse_t *pcVar13;
  char **ppcVar14;
  int n;
  int n2;
  int8_t to3;
  uintptr_t tp1;
  int8_t to5;
  int8_t to4;
  uintptr_t tp3;
  uintptr_t tp2;
  uintptr_t tp4;
  uintptr_t tp5;
  int pp;
  int local_94;
  char *local_90;
  int local_88;
  char local_81;
  uintptr_t local_80;
  char *local_78;
  char local_6a;
  char local_69;
  uintptr_t *local_68;
  cmdCtlParse_t *local_60;
  uintptr_t local_58;
  uintptr_t local_50;
  uintptr_t local_48;
  uintptr_t local_40;
  int local_34;
  byte bVar9;
  
  local_80 = 0;
  local_50 = 0;
  local_58 = 0;
  local_48 = 0;
  local_40 = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  uVar10 = 0;
  local_90 = buf;
  local_78 = ext;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&local_34);
  lVar12 = (long)ctl->eaten + (long)local_34;
  iVar4 = (int)lVar12;
  ctl->eaten = iVar4;
  *p = 0xffffffffffffffff;
  ppcVar14 = &cmdInfo[0].name;
  local_60 = ctl;
  do {
    iVar3 = strcasecmp(intCmdStr,*ppcVar14);
    pcVar13 = local_60;
    pcVar11 = local_90;
    if (iVar3 == 0) goto LAB_0012602d;
    uVar10 = uVar10 + 1;
    ppcVar14 = ppcVar14 + 4;
  } while (uVar10 != 0xa8);
  uVar10 = 0xffffffff;
LAB_0012602d:
  iVar3 = (int)uVar10;
  if (iVar3 < 0) {
    intCmdIdx = iVar3;
    return iVar3;
  }
  intCmdIdx = iVar3;
  *p = (long)cmdInfo[uVar10 & 0xffffffff].cmd;
  val = p + 1;
  val_00 = p + 2;
  p[1] = 0;
  p[2] = 0;
  p[3] = 0;
  bVar8 = true;
  local_68 = val_00;
  switch(cmdInfo[uVar10 & 0xffffffff].vt) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    goto switchD_00126085_caseD_66;
  case 0x6f:
    iVar4 = getNum(local_90 + lVar12,val,local_60->opt + 1);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    cVar1 = pcVar13->opt[1];
    goto LAB_0012686a;
  case 0x70:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    cVar1 = pcVar13->opt[1];
    goto joined_r0x001268f4;
  case 0x71:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    bVar8 = true;
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (pcVar13->opt[1] < '\x01') goto switchD_00126085_caseD_66;
    uVar10 = *val;
    goto LAB_001269d6;
  case 0x72:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    bVar8 = pcVar13->opt[1] != '\x01';
    goto switchD_00126085_caseD_66;
  case 0x73:
    pcVar11 = local_90 + iVar4;
    sVar7 = strlen(pcVar11);
    p[3] = sVar7;
    memcpy(local_78,pcVar11,sVar7);
    local_88 = (int)p[3];
    goto LAB_00126a46;
  case 0x74:
    iVar4 = __isoc99_sscanf(local_90 + iVar4," %*s%n %n",&local_94,&local_88);
    pcVar13 = local_60;
    bVar8 = true;
    if (local_94 == 0 || iVar4 < 0) goto switchD_00126085_caseD_66;
    p[3] = (long)local_94;
    local_60->opt[3] = '\x01';
    memcpy(local_78,local_90 + local_60->eaten,(long)local_94);
LAB_00126a46:
    pcVar13->eaten = pcVar13->eaten + local_88;
    break;
  case 0x79:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (pcVar13->opt[1] < '\x01') goto LAB_00126e5a;
    bVar8 = true;
    if (((*(byte *)((long)p + 0xb) & 0x80) != 0) || (pcVar13->opt[2] < '\x01'))
    goto switchD_00126085_caseD_66;
    bVar9 = *(byte *)((long)p + 0x13);
    goto LAB_001268fd;
  case 0x7a:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (pcVar13->opt[1] < '\x01') goto LAB_00126e5a;
    bVar8 = true;
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) goto switchD_00126085_caseD_66;
LAB_00126866:
    cVar1 = pcVar13->opt[2];
LAB_0012686a:
    bVar8 = cVar1 < '\x01';
    goto switchD_00126085_caseD_66;
  case 0x7b:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if ('\0' < pcVar13->opt[1]) {
      bVar8 = true;
      if (0x95 < *val) goto switchD_00126085_caseD_66;
      goto LAB_00126866;
    }
    goto LAB_00126e5a;
  case 0x7c:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (pcVar13->opt[1] < '\x01') goto LAB_00126e5a;
    bVar8 = true;
    if ((0x95 < *val) || (pcVar13->opt[2] < '\x01')) goto switchD_00126085_caseD_66;
    uVar10 = *val_00;
LAB_001269d6:
    bVar8 = 0x95 < uVar10;
    goto switchD_00126085_caseD_66;
  case 0x7d:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = __isoc99_sscanf(pcVar11 + lVar12," %c %n",&local_88,&local_94);
    if (pcVar13->opt[1] < '\x01') goto LAB_00126e5a;
    bVar8 = true;
    if ((iVar4 < 1) || ((*val & 0x80000000) != 0)) goto switchD_00126085_caseD_66;
    pcVar13->eaten = pcVar13->eaten + local_94;
    pp_Var5 = __ctype_toupper_loc();
    pvVar6 = memchr("RW540123",(*pp_Var5)[(char)local_88],9);
    bVar8 = true;
    if (pvVar6 == (void *)0x0) goto switchD_00126085_caseD_66;
    iVar4 = 0x12db00;
LAB_00126689:
    *val_00 = (long)((int)pvVar6 - iVar4);
    break;
  case 0x7e:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = __isoc99_sscanf(pcVar11 + lVar12," %c %n",&local_88,&local_94);
    if ('\0' < pcVar13->opt[1]) {
      bVar8 = true;
      if ((iVar4 < 1) || ((*val & 0x80000000) != 0)) goto switchD_00126085_caseD_66;
      pcVar13->eaten = pcVar13->eaten + local_94;
      pp_Var5 = __ctype_toupper_loc();
      pvVar6 = memchr("ODU",(*pp_Var5)[(char)local_88],4);
      bVar8 = true;
      if (pvVar6 == (void *)0x0) goto switchD_00126085_caseD_66;
      iVar4 = 0x12db09;
      goto LAB_00126689;
    }
    goto LAB_00126e5a;
  case 0x7f:
    iVar4 = __isoc99_sscanf(local_90 + iVar4," %*s%n %n",&local_94,&local_88);
    if (local_94 == 0 || iVar4 < 0) goto LAB_00126e5a;
    p[3] = (long)local_94;
    pcVar13->opt[2] = '\x01';
    memcpy(local_78,pcVar11 + pcVar13->eaten,(long)local_94);
    lVar12 = (long)pcVar13->eaten + (long)local_88;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val,pcVar13->opt + 1);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    cVar1 = pcVar13->opt[1];
joined_r0x001268f4:
    bVar8 = true;
    if ('\0' < cVar1) {
      bVar9 = *(byte *)((long)p + 0xb);
LAB_001268fd:
      bVar8 = (bool)(bVar9 >> 7);
    }
    goto switchD_00126085_caseD_66;
  case 0x80:
    iVar4 = __isoc99_sscanf(local_90 + iVar4," %*s%n %n",&local_94,&local_88);
    pcVar13 = local_60;
    pcVar11 = local_78;
    bVar8 = true;
    if (local_94 == 0 || iVar4 < 0) goto switchD_00126085_caseD_66;
    __n = (size_t)local_94;
    p[1] = __n;
    memcpy(local_78,local_90 + local_60->eaten,__n);
    pcVar13->eaten = pcVar13->eaten + local_94;
    pcVar11[__n] = '\0';
    __s = local_90 + (long)pcVar13->eaten + 1;
    sVar7 = strlen(__s);
    iVar4 = (int)sVar7;
    local_88 = iVar4;
    memcpy(pcVar11 + __n + 1,__s,(long)iVar4);
    pcVar13->eaten = pcVar13->eaten + iVar4 + 1;
    uVar10 = p[1] + (long)iVar4 + 1;
LAB_00126585:
    p[3] = uVar10;
    break;
  case 0x83:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_80,pcVar13->opt + 3);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (((pcVar13->opt[1] < '\x01') || ((*(byte *)((long)p + 0xb) & 0x80) != 0)) ||
       ((pcVar13->opt[2] < '\x01' || (((*local_68 & 0x80000000) != 0 || (pcVar13->opt[3] < '\x01')))
        ))) goto LAB_00126e5a;
joined_r0x001261e5:
    bVar8 = true;
    if ((local_80 & 0x80000000) != 0) goto switchD_00126085_caseD_66;
    p[3] = 4;
    *(undefined4 *)local_78 = (undefined4)local_80;
    break;
  case 0x84:
    iVar4 = __isoc99_sscanf(local_90 + iVar4," %*s%n %n",&local_94,&local_88);
    if (local_94 != 0 && -1 < iVar4) {
      p[3] = (long)local_94;
      pcVar13->opt[2] = '\x01';
      memcpy(local_78,pcVar11 + pcVar13->eaten,(long)local_94);
      lVar12 = (long)pcVar13->eaten + (long)local_88;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,val,pcVar13->opt + 1);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,local_68,pcVar13->opt + 2);
      pcVar13->eaten = pcVar13->eaten + iVar4;
      if ('\0' < pcVar13->opt[1]) {
        bVar8 = true;
        if (((*(byte *)((long)p + 0xb) & 0x80) != 0) || (pcVar13->opt[2] < '\x01'))
        goto switchD_00126085_caseD_66;
        bVar9 = *(byte *)((long)local_68 + 3);
        goto LAB_001268fd;
      }
    }
    goto LAB_00126e5a;
  case 0x85:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,local_68,pcVar13->opt + 2);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_80,(int8_t *)&local_94);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if ('\0' < pcVar13->opt[1]) {
      bVar8 = true;
      if ((((*(byte *)((long)p + 0xb) & 0x80) != 0) || (pcVar13->opt[2] < '\x01')) ||
         ((char)local_94 != '\x01')) goto switchD_00126085_caseD_66;
      goto joined_r0x001261e5;
    }
LAB_00126e5a:
    bVar8 = true;
    goto switchD_00126085_caseD_66;
  case 0x86:
    iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_80,(int8_t *)&local_94);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_50,(int8_t *)&local_88);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_58,&local_81);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_48,&local_69);
    lVar12 = (long)iVar4 + (long)pcVar13->eaten;
    pcVar13->eaten = (int)lVar12;
    iVar4 = getNum(pcVar11 + lVar12,&local_40,&local_6a);
    pcVar13->eaten = pcVar13->eaten + iVar4;
    if (pcVar13->opt[1] < '\x01') goto LAB_00126e5a;
    bVar8 = true;
    if (((((((*(byte *)((long)p + 0xb) & 0x80) != 0) || ((char)local_94 != '\x01')) ||
          ((local_80 & 0x80000000) != 0)) ||
         ((((char)local_88 != '\x01' || ((local_50 & 0x80000000) != 0)) ||
          ((local_81 != '\x01' || (((local_58 & 0x80000000) != 0 || (local_69 != '\x01')))))))) ||
        ((local_48 & 0x80000000) != 0)) || (local_6a != '\x01')) goto switchD_00126085_caseD_66;
    p[3] = 0x14;
    *(undefined4 *)local_78 = (undefined4)local_80;
    *(undefined4 *)(local_78 + 4) = (undefined4)local_50;
    *(undefined4 *)(local_78 + 8) = (undefined4)local_58;
    *(undefined4 *)(local_78 + 0xc) = (undefined4)local_48;
    *(undefined4 *)(local_78 + 0x10) = (undefined4)local_40;
    break;
  default:
    switch(cmdInfo[uVar10 & 0xffffffff].vt) {
    case 0xbf:
      iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
      pcVar2 = local_60;
      pcVar13->eaten = pcVar13->eaten + iVar4;
      if (pcVar13->opt[1] != '\x01') goto LAB_00126e5a;
      bVar8 = true;
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) goto switchD_00126085_caseD_66;
      lVar12 = 0;
      do {
        iVar4 = getNum(local_90 + pcVar2->eaten,&local_80,(int8_t *)&local_94);
        pcVar2->eaten = pcVar2->eaten + iVar4;
        if ((char)local_94 != '\x01') goto LAB_00126144;
        *(undefined4 *)(local_78 + lVar12 * 4) = (undefined4)local_80;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 10);
      lVar12 = 10;
LAB_00126144:
      p[3] = (ulong)(uint)((int)lVar12 << 2);
      break;
    case 0xc0:
      lVar12 = 0;
      do {
        iVar4 = getNum(local_90 + pcVar13->eaten,&local_80,(int8_t *)&local_94);
        pcVar13->eaten = pcVar13->eaten + iVar4;
        if ((char)local_94 != '\x01') goto LAB_00126cc5;
        *(undefined4 *)(local_78 + lVar12 * 4) = (undefined4)local_80;
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 != 0x200);
      lVar12 = 0x200;
LAB_00126cc5:
      iVar4 = (int)lVar12;
      p[3] = (ulong)(uint)(iVar4 * 4);
      bVar8 = 0x55555555 < (uint)(iVar4 * -0x55555555) || iVar4 == 0;
      goto switchD_00126085_caseD_66;
    case 0xc1:
      iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
      pcVar11 = local_78;
      pcVar13->eaten = pcVar13->eaten + iVar4;
      if (pcVar13->opt[1] != '\x01') goto LAB_00126e5a;
      bVar8 = true;
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) goto switchD_00126085_caseD_66;
      uVar10 = 0;
      do {
        iVar4 = getNum(local_90 + pcVar13->eaten,&local_80,(int8_t *)&local_94);
        if (((char)local_94 != '\x01') || ((local_80 & 0xffffff00) != 0)) goto LAB_00126b90;
        pcVar11[uVar10] = (char)local_80;
        uVar10 = uVar10 + 1;
        pcVar13->eaten = pcVar13->eaten + iVar4;
      } while ((int)uVar10 != 0x200);
      uVar10 = 0x200;
LAB_00126b90:
      p[3] = uVar10 & 0xffffffff;
      bVar8 = true;
      if (((int)uVar10 == 0) && (*p != 0x72)) goto switchD_00126085_caseD_66;
      break;
    case 0xc2:
      iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
      pcVar2 = local_60;
      pcVar11 = local_78;
      pcVar13->eaten = pcVar13->eaten + iVar4;
      if (pcVar13->opt[1] == '\x01') {
        bVar8 = true;
        if (((pcVar13->opt[2] != '\x01') || ((*(byte *)((long)p + 0xb) & 0x80) != 0)) ||
           ((*local_68 & 0xffffff00) != 0)) goto switchD_00126085_caseD_66;
        uVar10 = 0;
        do {
          iVar4 = getNum(local_90 + pcVar2->eaten,&local_80,(int8_t *)&local_94);
          if (((char)local_94 != '\x01') || ((local_80 & 0xffffff00) != 0)) goto LAB_00126c74;
          pcVar11[uVar10] = (char)local_80;
          uVar10 = uVar10 + 1;
          pcVar2->eaten = pcVar2->eaten + iVar4;
        } while ((int)uVar10 != 0x20);
        uVar10 = 0x20;
LAB_00126c74:
        iVar4 = (int)uVar10;
        uVar10 = uVar10 & 0xffffffff;
LAB_00126e51:
        p[3] = uVar10;
        goto LAB_00126ed3;
      }
      goto LAB_00126e5a;
    case 0xc3:
      iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      if (pcVar13->opt[1] == '\x01') {
        if ((*(byte *)((long)p + 0xb) & 0x80) != 0) goto LAB_00126e5a;
        iVar4 = getNum(local_90 + lVar12,val_00,pcVar13->opt + 2);
        pcVar2 = local_60;
        pcVar11 = local_78;
        pcVar13->eaten = pcVar13->eaten + iVar4;
        if (pcVar13->opt[2] == '\x01') {
          bVar8 = true;
          if ((*(byte *)((long)p + 0x13) & 0x80) != 0) goto switchD_00126085_caseD_66;
          uVar10 = 0;
          do {
            iVar4 = getNum(local_90 + pcVar2->eaten,&local_80,(int8_t *)&local_94);
            if (((char)local_94 != '\x01') || ((local_80 & 0xffffff00) != 0)) goto LAB_00126b0a;
            pcVar11[uVar10] = (char)local_80;
            uVar10 = uVar10 + 1;
            pcVar2->eaten = pcVar2->eaten + iVar4;
          } while ((int)uVar10 != 0x200);
          uVar10 = 0x200;
LAB_00126b0a:
          uVar10 = uVar10 & 0xffffffff;
          goto LAB_00126585;
        }
      }
      break;
    case 0xc4:
      iVar4 = getNum(local_90 + iVar4,val,local_60->opt + 1);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,val_00,pcVar13->opt + 2);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,&local_80,(int8_t *)&local_94);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,&local_50,(int8_t *)&local_88);
      lVar12 = (long)iVar4 + (long)pcVar13->eaten;
      pcVar13->eaten = (int)lVar12;
      iVar4 = getNum(pcVar11 + lVar12,&local_58,&local_81);
      pcVar2 = local_60;
      pcVar11 = local_78;
      pcVar13->eaten = pcVar13->eaten + iVar4;
      if (pcVar13->opt[1] == '\x01') {
        bVar8 = true;
        if ((((((*(byte *)((long)p + 0xb) & 0x80) != 0) || (pcVar13->opt[2] != '\x01')) ||
             ((int)*local_68 < 1)) || (((char)local_94 != '\x01' || ((char)local_88 != '\x01')))) ||
           (local_81 != '\x01')) goto switchD_00126085_caseD_66;
        *(undefined4 *)local_78 = (undefined4)local_80;
        *(undefined4 *)(local_78 + 4) = (undefined4)local_50;
        *(undefined4 *)(local_78 + 8) = (undefined4)local_58;
        lVar12 = 0;
        do {
          iVar4 = getNum(local_90 + pcVar2->eaten,&local_80,(int8_t *)&local_94);
          if (((char)local_94 != '\x01') || ((local_80 & 0xffffff00) != 0)) goto LAB_00126e4c;
          pcVar11[lVar12 + 0xc] = (char)local_80;
          lVar12 = lVar12 + 1;
          pcVar2->eaten = pcVar2->eaten + iVar4;
        } while ((int)lVar12 != 0x200);
        lVar12 = 0x200;
LAB_00126e4c:
        iVar4 = (int)lVar12;
        uVar10 = (ulong)(iVar4 + 0xc);
        goto LAB_00126e51;
      }
      goto LAB_00126e5a;
    case 0xc5:
      uVar10 = 0;
      do {
        iVar4 = getNum(pcVar11 + pcVar13->eaten,&local_80,(int8_t *)&local_94);
        if (((char)local_94 != '\x01') || ((local_80 & 0xffffff00) != 0)) goto LAB_00126ec9;
        local_78[uVar10] = (char)local_80;
        uVar10 = uVar10 + 1;
        pcVar13->eaten = pcVar13->eaten + iVar4;
      } while ((int)uVar10 != 0x200);
      uVar10 = 0x200;
LAB_00126ec9:
      iVar4 = (int)uVar10;
      p[3] = uVar10 & 0xffffffff;
LAB_00126ed3:
      bVar8 = iVar4 == 0;
    default:
      goto switchD_00126085_caseD_66;
    }
  }
  bVar8 = false;
switchD_00126085_caseD_66:
  if (bVar8 != false) {
    iVar3 = -2;
  }
  return iVar3;
}

Assistant:

int cmdParse(
   char *buf, uintptr_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uintptr_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   intCmdIdx = idx;

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}